

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::RectLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,RectLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  _Base_ptr __k;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  const_iterator cVar8;
  mapped_type *this;
  _Base_ptr p_Var9;
  Property *args;
  char *pcVar10;
  char *pcVar11;
  string *psVar12;
  ulong uVar13;
  ParseResult ret;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_3b8;
  undefined1 local_398 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  string *local_370;
  long *local_368 [2];
  long local_358 [2];
  Property *local_348;
  string *local_340;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_338;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_330;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  undefined1 local_2f8 [16];
  code *local_2e8;
  code *pcStack_2e0;
  ios_base local_288 [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_180;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *local_178;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_170;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_168;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_160;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *local_158;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *local_150;
  _Base_ptr local_148;
  ulong local_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_328._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_328._M_impl.super__Rb_tree_header._M_header;
  local_328._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar13 = 0;
  local_328._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_328._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_370 = err;
  local_340 = warn;
  local_328._M_impl.super__Rb_tree_header._M_header._M_right =
       local_328._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar4 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_328,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar4) {
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_148 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    uVar13 = (ulong)(p_Var9 == local_148);
    if (p_Var9 != local_148) {
      local_150 = &light->file;
      local_158 = &(light->super_BoundableLight).color;
      local_160 = &light->height;
      local_168 = &light->width;
      local_170 = &(light->super_BoundableLight).intensity;
      local_178 = &(light->super_BoundableLight).extent;
      local_180 = &(light->super_BoundableLight).props;
      local_338 = &(light->super_BoundableLight).purpose;
      local_330 = &(light->super_BoundableLight).visibility;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_140 = uVar13;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        psVar12 = (string *)local_2f8;
        local_2f8._0_8_ = &local_2e8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar12,"inputs:texture:file","");
        local_348 = (Property *)(p_Var9 + 2);
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::AssetPath>
                  ((ParseResult *)local_398,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_328,&local_98,(Property *)(p_Var9 + 2),psVar12,local_150);
        if ((code **)local_2f8._0_8_ != &local_2e8) {
          operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        uVar13 = local_140;
        iVar5 = 0;
        if ((local_398._0_8_ & 0xfffffffd) == 0) {
          iVar5 = 3;
LAB_00206010:
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (local_398._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
            poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xcb2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            local_368[0] = local_358;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[20],std::__cxx11::string>
                      (&local_3b8,(fmt *)local_368,(string *)"inputs:texture:file",
                       (char (*) [20])(local_398 + 8),psVar12);
            poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2f8,local_3b8._M_dataplus._M_p,
                                local_3b8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
              operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1
                             );
            }
            psVar12 = local_370;
            if (local_368[0] != local_358) {
              operator_delete(local_368[0],local_358[0] + 1);
            }
            if (psVar12 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar7 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_368,(ulong)(psVar12->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_3b8.field_2._M_allocated_capacity = *psVar1;
                local_3b8.field_2._8_8_ = plVar7[3];
                local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
              }
              else {
                local_3b8.field_2._M_allocated_capacity = *psVar1;
                local_3b8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_3b8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar12,(string *)&local_3b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                operator_delete(local_3b8._M_dataplus._M_p,
                                local_3b8.field_2._M_allocated_capacity + 1);
              }
              if (local_368[0] != local_358) {
                operator_delete(local_368[0],local_358[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
            ::std::ios_base::~ios_base(local_288);
            iVar5 = 1;
            goto LAB_00206010;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._8_8_ != &local_380) {
          operator_delete((void *)local_398._8_8_,local_380._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          psVar12 = (string *)local_2f8;
          local_2f8._0_8_ = &local_2e8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar12,"inputs:color","");
          anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                    ((ParseResult *)local_398,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_328,&local_b8,local_348,psVar12,local_158);
          if ((code **)local_2f8._0_8_ != &local_2e8) {
            operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          iVar5 = 0;
          if ((local_398._0_8_ & 0xfffffffd) == 0) {
            iVar5 = 3;
LAB_0020632c:
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if (local_398._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
              poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xcb3);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
              local_368[0] = local_358;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_368,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[13],std::__cxx11::string>
                        (&local_3b8,(fmt *)local_368,(string *)"inputs:color",
                         (char (*) [13])(local_398 + 8),psVar12);
              poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2f8,local_3b8._M_dataplus._M_p,
                                  local_3b8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                operator_delete(local_3b8._M_dataplus._M_p,
                                local_3b8.field_2._M_allocated_capacity + 1);
              }
              psVar12 = local_370;
              if (local_368[0] != local_358) {
                operator_delete(local_368[0],local_358[0] + 1);
              }
              if (psVar12 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar7 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_368,(ulong)(psVar12->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_3b8.field_2._M_allocated_capacity = *psVar1;
                  local_3b8.field_2._8_8_ = plVar7[3];
                  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                }
                else {
                  local_3b8.field_2._M_allocated_capacity = *psVar1;
                  local_3b8._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_3b8._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar12,(string *)&local_3b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                  operator_delete(local_3b8._M_dataplus._M_p,
                                  local_3b8.field_2._M_allocated_capacity + 1);
                }
                if (local_368[0] != local_358) {
                  operator_delete(local_368[0],local_358[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
              ::std::ios_base::~ios_base(local_288);
              iVar5 = 1;
              goto LAB_0020632c;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._8_8_ != &local_380) {
            operator_delete((void *)local_398._8_8_,local_380._M_allocated_capacity + 1);
          }
          if (bVar4) {
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,*(long *)(p_Var9 + 1),
                       (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
            psVar12 = (string *)local_2f8;
            local_2f8._0_8_ = &local_2e8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar12,"inputs:height","");
            anon_unknown_0::ParseTypedAttribute<float>
                      ((ParseResult *)local_398,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_328,&local_d8,local_348,psVar12,local_160);
            if ((code **)local_2f8._0_8_ != &local_2e8) {
              operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            iVar5 = 0;
            if ((local_398._0_8_ & 0xfffffffd) == 0) {
              iVar5 = 3;
LAB_00206648:
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if (local_398._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3);
                poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xcb4);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                local_368[0] = local_358;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_368,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[14],std::__cxx11::string>
                          (&local_3b8,(fmt *)local_368,(string *)"inputs:height",
                           (char (*) [14])(local_398 + 8),psVar12);
                poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_2f8,local_3b8._M_dataplus._M_p,
                                    local_3b8._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                  operator_delete(local_3b8._M_dataplus._M_p,
                                  local_3b8.field_2._M_allocated_capacity + 1);
                }
                psVar12 = local_370;
                if (local_368[0] != local_358) {
                  operator_delete(local_368[0],local_358[0] + 1);
                }
                if (psVar12 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar7 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)local_368,(ulong)(psVar12->_M_dataplus)._M_p);
                  psVar1 = (size_type *)(plVar7 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar1) {
                    local_3b8.field_2._M_allocated_capacity = *psVar1;
                    local_3b8.field_2._8_8_ = plVar7[3];
                    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                  }
                  else {
                    local_3b8.field_2._M_allocated_capacity = *psVar1;
                    local_3b8._M_dataplus._M_p = (pointer)*plVar7;
                  }
                  local_3b8._M_string_length = plVar7[1];
                  *plVar7 = (long)psVar1;
                  plVar7[1] = 0;
                  *(undefined1 *)(plVar7 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar12,(string *)&local_3b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                    operator_delete(local_3b8._M_dataplus._M_p,
                                    local_3b8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_368[0] != local_358) {
                    operator_delete(local_368[0],local_358[0] + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                ::std::ios_base::~ios_base(local_288);
                iVar5 = 1;
                goto LAB_00206648;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._8_8_ != &local_380) {
              operator_delete((void *)local_398._8_8_,local_380._M_allocated_capacity + 1);
            }
            if (bVar4) {
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f8,*(long *)(p_Var9 + 1),
                         (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
              psVar12 = (string *)local_2f8;
              local_2f8._0_8_ = &local_2e8;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar12,"inputs:width","")
              ;
              anon_unknown_0::ParseTypedAttribute<float>
                        ((ParseResult *)local_398,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_328,&local_f8,local_348,psVar12,local_168);
              if ((code **)local_2f8._0_8_ != &local_2e8) {
                operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              iVar5 = 0;
              if ((local_398._0_8_ & 0xfffffffd) == 0) {
                iVar5 = 3;
LAB_00206964:
                bVar4 = false;
              }
              else {
                bVar4 = true;
                if (local_398._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,"():",3)
                  ;
                  poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xcb5);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                  local_368[0] = local_358;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_368,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[13],std::__cxx11::string>
                            (&local_3b8,(fmt *)local_368,(string *)"inputs:width",
                             (char (*) [13])(local_398 + 8),psVar12);
                  poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_2f8,local_3b8._M_dataplus._M_p,
                                      local_3b8._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                    operator_delete(local_3b8._M_dataplus._M_p,
                                    local_3b8.field_2._M_allocated_capacity + 1);
                  }
                  psVar12 = local_370;
                  if (local_368[0] != local_358) {
                    operator_delete(local_368[0],local_358[0] + 1);
                  }
                  if (psVar12 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar7 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)local_368,(ulong)(psVar12->_M_dataplus)._M_p
                                               );
                    psVar1 = (size_type *)(plVar7 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar7 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar1) {
                      local_3b8.field_2._M_allocated_capacity = *psVar1;
                      local_3b8.field_2._8_8_ = plVar7[3];
                      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                    }
                    else {
                      local_3b8.field_2._M_allocated_capacity = *psVar1;
                      local_3b8._M_dataplus._M_p = (pointer)*plVar7;
                    }
                    local_3b8._M_string_length = plVar7[1];
                    *plVar7 = (long)psVar1;
                    plVar7[1] = 0;
                    *(undefined1 *)(plVar7 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar12,(string *)&local_3b8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                      operator_delete(local_3b8._M_dataplus._M_p,
                                      local_3b8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_368[0] != local_358) {
                      operator_delete(local_368[0],local_358[0] + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                  ::std::ios_base::~ios_base(local_288);
                  iVar5 = 1;
                  goto LAB_00206964;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._8_8_ != &local_380) {
                operator_delete((void *)local_398._8_8_,local_380._M_allocated_capacity + 1);
              }
              if (bVar4) {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_118,*(long *)(p_Var9 + 1),
                           (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
                psVar12 = (string *)local_2f8;
                local_2f8._0_8_ = &local_2e8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)psVar12,"inputs:intensity","");
                anon_unknown_0::ParseTypedAttribute<float>
                          ((ParseResult *)local_398,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_328,&local_118,local_348,psVar12,local_170);
                if ((code **)local_2f8._0_8_ != &local_2e8) {
                  operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                iVar5 = 0;
                if ((local_398._0_8_ & 0xfffffffd) == 0) {
                  iVar5 = 3;
LAB_00206c80:
                  bVar4 = false;
                }
                else {
                  bVar4 = true;
                  if (local_398._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f8,"():",3);
                    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f8,0xcb7)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    local_368[0] = local_358;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_368,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[17],std::__cxx11::string>
                              (&local_3b8,(fmt *)local_368,(string *)"inputs:intensity",
                               (char (*) [17])(local_398 + 8),psVar12);
                    poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_2f8,local_3b8._M_dataplus._M_p,
                                        local_3b8._M_string_length);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                      operator_delete(local_3b8._M_dataplus._M_p,
                                      local_3b8.field_2._M_allocated_capacity + 1);
                    }
                    psVar12 = local_370;
                    if (local_368[0] != local_358) {
                      operator_delete(local_368[0],local_358[0] + 1);
                    }
                    if (psVar12 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar7 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)local_368,
                                                  (ulong)(psVar12->_M_dataplus)._M_p);
                      psVar1 = (size_type *)(plVar7 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar7 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar1) {
                        local_3b8.field_2._M_allocated_capacity = *psVar1;
                        local_3b8.field_2._8_8_ = plVar7[3];
                        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                      }
                      else {
                        local_3b8.field_2._M_allocated_capacity = *psVar1;
                        local_3b8._M_dataplus._M_p = (pointer)*plVar7;
                      }
                      local_3b8._M_string_length = plVar7[1];
                      *plVar7 = (long)psVar1;
                      plVar7[1] = 0;
                      *(undefined1 *)(plVar7 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)psVar12,(string *)&local_3b8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                        operator_delete(local_3b8._M_dataplus._M_p,
                                        local_3b8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_368[0] != local_358) {
                        operator_delete(local_368[0],local_358[0] + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                    ::std::ios_base::~ios_base(local_288);
                    iVar5 = 1;
                    goto LAB_00206c80;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_398._8_8_ != &local_380) {
                  operator_delete((void *)local_398._8_8_,local_380._M_allocated_capacity + 1);
                }
                if (bVar4) {
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_138,*(long *)(p_Var9 + 1),
                             (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
                  local_2f8._0_8_ = &local_2e8;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"extent","")
                  ;
                  args = local_348;
                  anon_unknown_0::ParseExtentAttribute
                            ((ParseResult *)local_398,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_328,&local_138,local_348,(string *)local_2f8,local_178);
                  if ((code **)local_2f8._0_8_ != &local_2e8) {
                    operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_138._M_dataplus._M_p != &local_138.field_2) {
                    operator_delete(local_138._M_dataplus._M_p,
                                    local_138.field_2._M_allocated_capacity + 1);
                  }
                  iVar5 = 0;
                  if ((local_398._0_8_ & 0xfffffffd) == 0) {
                    iVar5 = 3;
LAB_00206f95:
                    bVar4 = false;
                  }
                  else {
                    bVar4 = true;
                    if (local_398._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2f8,"():",3);
                      poVar6 = (ostream *)
                               ::std::ostream::operator<<((ostringstream *)local_2f8,0xcb8);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      local_368[0] = local_358;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_368,"Parsing attribute `extent` failed. Error: {}",
                                 "");
                      fmt::format<std::__cxx11::string>
                                ((string *)&local_3b8,(fmt *)local_368,(string *)(local_398 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)args);
                      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)local_2f8,local_3b8._M_dataplus._M_p,
                                          local_3b8._M_string_length);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                        operator_delete(local_3b8._M_dataplus._M_p,
                                        local_3b8.field_2._M_allocated_capacity + 1);
                      }
                      psVar12 = local_370;
                      if (local_368[0] != local_358) {
                        operator_delete(local_368[0],local_358[0] + 1);
                      }
                      if (psVar12 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        plVar7 = (long *)::std::__cxx11::string::_M_append
                                                   ((char *)local_368,
                                                    (ulong)(psVar12->_M_dataplus)._M_p);
                        psVar1 = (size_type *)(plVar7 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar7 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar1) {
                          local_3b8.field_2._M_allocated_capacity = *psVar1;
                          local_3b8.field_2._8_8_ = plVar7[3];
                          local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
                        }
                        else {
                          local_3b8.field_2._M_allocated_capacity = *psVar1;
                          local_3b8._M_dataplus._M_p = (pointer)*plVar7;
                        }
                        local_3b8._M_string_length = plVar7[1];
                        *plVar7 = (long)psVar1;
                        plVar7[1] = 0;
                        *(undefined1 *)(plVar7 + 2) = 0;
                        ::std::__cxx11::string::operator=((string *)psVar12,(string *)&local_3b8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                          operator_delete(local_3b8._M_dataplus._M_p,
                                          local_3b8.field_2._M_allocated_capacity + 1);
                        }
                        if (local_368[0] != local_358) {
                          operator_delete(local_368[0],local_358[0] + 1);
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                      ::std::ios_base::~ios_base(local_288);
                      iVar5 = 1;
                      goto LAB_00206f95;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_398._8_8_ != &local_380) {
                    operator_delete((void *)local_398._8_8_,local_380._M_allocated_capacity + 1);
                  }
                  if (bVar4) {
                    __k = p_Var9 + 1;
                    iVar5 = ::std::__cxx11::string::compare((char *)__k);
                    if (iVar5 == 0) {
                      local_2f8._0_8_ = &local_2e8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_2f8,"visibility","");
                      cVar8 = ::std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_328,(key_type *)local_2f8);
                      if ((code **)local_2f8._0_8_ != &local_2e8) {
                        operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                      }
                      iVar5 = 3;
                      if ((_Rb_tree_header *)cVar8._M_node ==
                          &local_328._M_impl.super__Rb_tree_header) {
                        if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                          local_2f8._0_8_ = &local_2e8;
                          local_2f8._8_8_ = 0;
                          local_2e8 = (code *)((ulong)local_2e8 & 0xffffffffffffff00);
                        }
                        else {
                          Attribute::type_name_abi_cxx11_((string *)local_2f8,&local_348->_attrib);
                        }
                        local_398._0_8_ = local_398 + 0x10;
                        local_398[0x14] = 'n';
                        local_398._16_4_ = 0x656b6f74;
                        local_398._8_8_ =
                             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x5;
                        local_398[0x15] = '\0';
                        if (((local_2f8._8_8_ == 5) &&
                            (iVar5 = bcmp((void *)local_2f8._0_8_,local_398 + 0x10,5), iVar5 == 0))
                           && (uVar3 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar3 < 2)) {
                          if ((code **)local_2f8._0_8_ != &local_2e8) {
                            operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                          }
                          if (uVar3 == 0) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"[warn]",6);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"():",3);
                            poVar6 = (ostream *)
                                     ::std::ostream::operator<<((ostringstream *)local_2f8,0xcba);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"No value assigned to `",0x16);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"visibility",10);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,
                                       "` token attribute. Set default token value.",0x2b);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_2f8,"\n",1);
                            if (local_340 != (string *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_398,&local_3b8,local_370);
                              ::std::__cxx11::string::operator=
                                        ((string *)local_340,(string *)local_398);
                              if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                                operator_delete((void *)local_398._0_8_,
                                                CONCAT26(local_398._22_2_,
                                                         CONCAT15(local_398[0x15],
                                                                  CONCAT14(local_398[0x14],
                                                                           local_398._16_4_))) + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                                operator_delete(local_3b8._M_dataplus._M_p,
                                                local_3b8.field_2._M_allocated_capacity + 1);
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_2f8);
                            ::std::ios_base::~ios_base(local_288);
                            AttrMetas::operator=(&local_330->_metas,(AttrMetas *)(p_Var9 + 7));
                            pcVar11 = "visibility";
                            pcVar10 = "";
LAB_0020797d:
                            iVar5 = 3;
                            local_2f8._0_8_ = &local_2e8;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_2f8,pcVar11,pcVar10);
                            ::std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&local_328,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2f8);
                            if ((code **)local_2f8._0_8_ != &local_2e8) {
                              operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                            }
                            goto LAB_00207b95;
                          }
                        }
                        else if ((code **)local_2f8._0_8_ != &local_2e8) {
                          operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                        }
                        local_2f8._8_8_ = 0;
                        local_2f8._0_8_ = VisibilityEnumHandler;
                        pcStack_2e0 = ::std::
                                      _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      ::_M_invoke;
                        local_2e8 = ::std::
                                    _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                    ::_M_manager;
                        local_398._0_8_ = local_398 + 0x10;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_398,"visibility","");
                        bVar4 = options->strict_allowedToken_check;
                        local_48 = (code *)0x0;
                        pcStack_40 = (code *)0x0;
                        local_58._M_unused._M_object = (void *)0x0;
                        local_58._8_8_ = 0;
                        if (local_2e8 != (code *)0x0) {
                          (*local_2e8)(&local_58,local_2f8,2);
                          local_48 = local_2e8;
                          pcStack_40 = pcStack_2e0;
                        }
                        bVar4 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                          ((string *)local_398,bVar4,
                                           (EnumHandlerFun<tinyusdz::Visibility> *)&local_58,
                                           &local_348->_attrib,local_330,local_340,local_370);
                        if (local_48 != (code *)0x0) {
                          (*local_48)(&local_58,&local_58,__destroy_functor);
                        }
                        if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                          operator_delete((void *)local_398._0_8_,
                                          CONCAT26(local_398._22_2_,
                                                   CONCAT15(local_398[0x15],
                                                            CONCAT14(local_398[0x14],
                                                                     local_398._16_4_))) + 1);
                        }
                        iVar5 = 1;
                        if (bVar4) {
                          AttrMetas::operator=(&local_330->_metas,(AttrMetas *)(p_Var9 + 7));
                          pcVar11 = "visibility";
                          pcVar10 = "";
LAB_00207b44:
                          local_398._0_8_ = local_398 + 0x10;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_398,pcVar11,pcVar10);
                          ::std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&local_328,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_398);
                          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                            operator_delete((void *)local_398._0_8_,
                                            CONCAT26(local_398._22_2_,
                                                     CONCAT15(local_398[0x15],
                                                              CONCAT14(local_398[0x14],
                                                                       local_398._16_4_))) + 1);
                          }
                          iVar5 = 3;
                        }
LAB_00207b76:
                        if (local_2e8 != (code *)0x0) {
                          (*local_2e8)(local_2f8,local_2f8,3);
                        }
                      }
                    }
                    else {
                      iVar5 = ::std::__cxx11::string::compare((char *)__k);
                      p_Var2 = &local_328._M_impl.super__Rb_tree_header;
                      if (iVar5 == 0) {
                        local_2f8._0_8_ = &local_2e8;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_2f8,"purpose","");
                        cVar8 = ::std::
                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_328,(key_type *)local_2f8);
                        if ((code **)local_2f8._0_8_ != &local_2e8) {
                          operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                        }
                        iVar5 = 3;
                        if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
                          if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                            local_2f8._0_8_ = &local_2e8;
                            local_2f8._8_8_ = 0;
                            local_2e8 = (code *)((ulong)local_2e8 & 0xffffffffffffff00);
                          }
                          else {
                            Attribute::type_name_abi_cxx11_((string *)local_2f8,&local_348->_attrib)
                            ;
                          }
                          local_398._0_8_ = local_398 + 0x10;
                          local_398[0x14] = 'n';
                          local_398._16_4_ = 0x656b6f74;
                          local_398._8_8_ =
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x5;
                          local_398[0x15] = '\0';
                          if (((local_2f8._8_8_ == 5) &&
                              (iVar5 = bcmp((void *)local_2f8._0_8_,local_398 + 0x10,5), iVar5 == 0)
                              ) && (uVar3 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar3 < 2)
                             ) {
                            if ((code **)local_2f8._0_8_ != &local_2e8) {
                              operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                            }
                            if (uVar3 == 0) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_2f8);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"[warn]",6);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"():",3);
                              poVar6 = (ostream *)
                                       ::std::ostream::operator<<((ostringstream *)local_2f8,0xcbc);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"No value assigned to `",0x16);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"purpose",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,
                                         "` token attribute. Set default token value.",0x2b);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_2f8,"\n",1);
                              if (local_340 != (string *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_398,&local_3b8,local_370);
                                ::std::__cxx11::string::operator=
                                          ((string *)local_340,(string *)local_398);
                                if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                                  operator_delete((void *)local_398._0_8_,
                                                  CONCAT26(local_398._22_2_,
                                                           CONCAT15(local_398[0x15],
                                                                    CONCAT14(local_398[0x14],
                                                                             local_398._16_4_))) + 1
                                                 );
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                                  operator_delete(local_3b8._M_dataplus._M_p,
                                                  local_3b8.field_2._M_allocated_capacity + 1);
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_2f8);
                              ::std::ios_base::~ios_base(local_288);
                              AttrMetas::operator=(&local_338->_metas,(AttrMetas *)(p_Var9 + 7));
                              pcVar11 = "purpose";
                              pcVar10 = "";
                              goto LAB_0020797d;
                            }
                          }
                          else if ((code **)local_2f8._0_8_ != &local_2e8) {
                            operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
                          }
                          local_2f8._8_8_ = 0;
                          local_2f8._0_8_ = PurposeEnumHandler;
                          pcStack_2e0 = ::std::
                                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                        ::_M_invoke;
                          local_2e8 = ::std::
                                      _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                                      ::_M_manager;
                          local_398._0_8_ = local_398 + 0x10;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_398,"purpose","");
                          bVar4 = options->strict_allowedToken_check;
                          local_68 = (code *)0x0;
                          pcStack_60 = (code *)0x0;
                          local_78._M_unused._M_object = (void *)0x0;
                          local_78._8_8_ = 0;
                          if (local_2e8 != (code *)0x0) {
                            (*local_2e8)(&local_78,local_2f8,2);
                            local_68 = local_2e8;
                            pcStack_60 = pcStack_2e0;
                          }
                          bVar4 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                            ((string *)local_398,bVar4,
                                             (EnumHandlerFun<tinyusdz::Purpose> *)&local_78,
                                             &local_348->_attrib,local_338,local_340,local_370);
                          if (local_68 != (code *)0x0) {
                            (*local_68)(&local_78,&local_78,__destroy_functor);
                          }
                          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                            operator_delete((void *)local_398._0_8_,
                                            CONCAT26(local_398._22_2_,
                                                     CONCAT15(local_398[0x15],
                                                              CONCAT14(local_398[0x14],
                                                                       local_398._16_4_))) + 1);
                          }
                          iVar5 = 1;
                          if (bVar4) {
                            AttrMetas::operator=(&local_338->_metas,(AttrMetas *)(p_Var9 + 7));
                            pcVar11 = "purpose";
                            pcVar10 = "";
                            goto LAB_00207b44;
                          }
                          goto LAB_00207b76;
                        }
                      }
                      else {
                        cVar8 = ::std::
                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_328,(key_type *)__k);
                        if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
                          this = ::std::
                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                 ::operator[](local_180,(key_type *)__k);
                          Property::operator=(this,local_348);
                          ::std::
                          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          ::_M_insert_unique<std::__cxx11::string_const&>
                                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      *)&local_328,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__k);
                        }
                        cVar8 = ::std::
                                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_328,(key_type *)__k);
                        iVar5 = 0;
                        if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,"[warn]",6);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_2f8,"():",3);
                          poVar6 = (ostream *)
                                   ::std::ostream::operator<<((ostringstream *)local_2f8,0xcbe);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_398,"Unsupported/unimplemented property: ",
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)__k);
                          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                                             ((ostream *)local_2f8,(char *)local_398._0_8_,
                                              local_398._8_8_);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                          if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                            operator_delete((void *)local_398._0_8_,
                                            CONCAT26(local_398._22_2_,
                                                     CONCAT15(local_398[0x15],
                                                              CONCAT14(local_398[0x14],
                                                                       local_398._16_4_))) + 1);
                          }
                          if (local_340 != (string *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_398,&local_3b8,local_370);
                            ::std::__cxx11::string::operator=
                                      ((string *)local_340,(string *)local_398);
                            if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
                              operator_delete((void *)local_398._0_8_,
                                              CONCAT26(local_398._22_2_,
                                                       CONCAT15(local_398[0x15],
                                                                CONCAT14(local_398[0x14],
                                                                         local_398._16_4_))) + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
                              operator_delete(local_3b8._M_dataplus._M_p,
                                              local_3b8.field_2._M_allocated_capacity + 1);
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
                          ::std::ios_base::~ios_base(local_288);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_00207b95:
        if ((iVar5 != 3) && (iVar5 != 0)) break;
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
        uVar13 = CONCAT71((int7)(uVar13 >> 8),p_Var9 == local_148);
      } while (p_Var9 != local_148);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_328,(_Link_type)local_328._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)((byte)uVar13 & 1);
}

Assistant:

bool ReconstructPrim<RectLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    RectLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:texture:file", UsdUVTexture, light->file)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", RectLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:height", RectLight, light->height)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:width", RectLight, light->width)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", RectLight,
                   light->intensity)
    PARSE_EXTENT_ATTRIBUTE(table, prop, kExtent, RectLight, light->extent)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, RectLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, RectLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}